

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug * __thiscall QDebug::operator<<(QDebug *this,char *t)

{
  QTextStream *this_00;
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView local_50;
  QArrayDataPointer<char16_t> local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTextStream *)this->stream;
  local_28 = t;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_50,&local_28);
  QVar2.m_data = (storage_type *)local_50.m_size;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(this_00,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = maybeSpace(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug &operator<<(const char* t) { stream->ts << QString::fromUtf8(t); return maybeSpace(); }